

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_nlzc_d_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  float64 fVar1;
  int64_t iVar2;
  
  fVar1 = msa_nlzc_df(3,(env->active_fpu).fpr[ws].fd);
  (env->active_fpu).fpr[wd].fd = fVar1;
  iVar2 = msa_nlzc_df(3,*(int64_t *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8));
  *(int64_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar2;
  return;
}

Assistant:

void helper_msa_nlzc_d(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->d[0]  = msa_nlzc_df(DF_DOUBLE, pws->d[0]);
    pwd->d[1]  = msa_nlzc_df(DF_DOUBLE, pws->d[1]);
}